

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void in2_r2(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGv_i64 pTVar1;
  
  if (((s->fields).presentO & 2) != 0) {
    pTVar1 = load_reg(s->uc->tcg_ctx,(s->fields).c[1]);
    o->in2 = pTVar1;
    return;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static void in2_r2(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in2 = load_reg(tcg_ctx, get_field(s, r2));
}